

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O3

in_port_t ngx_inet_get_port(sockaddr *sa)

{
  ushort uVar1;
  
  if (sa->sa_family == 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)sa->sa_data << 8 | *(ushort *)sa->sa_data >> 8;
  }
  return uVar1;
}

Assistant:

in_port_t
ngx_inet_get_port(struct sockaddr *sa)
{
    struct sockaddr_in   *sin;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6  *sin6;
#endif

    switch (sa->sa_family) {

#if (NGX_HAVE_INET6)
    case AF_INET6:
        sin6 = (struct sockaddr_in6 *) sa;
        return ntohs(sin6->sin6_port);
#endif

#if (NGX_HAVE_UNIX_DOMAIN)
    case AF_UNIX:
        return 0;
#endif

    default: /* AF_INET */
        sin = (struct sockaddr_in *) sa;
        return ntohs(sin->sin_port);
    }
}